

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QModelIndex,_int>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QModelIndex,_int>_> *old)

{
  QArrayData *pQVar1;
  bool bVar2;
  quintptr qVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  pair<QModelIndex,_int> *ppVar8;
  pair<QModelIndex,_int> *ppVar9;
  qsizetype qVar10;
  long lVar11;
  pair<QModelIndex,_int> *ppVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QArrayDataPointer<std::pair<QModelIndex,_int>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar2)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar10 = 0;
        lVar11 = 0;
      }
      else {
        qVar10 = pQVar1->alloc;
        lVar11 = (this->size - pQVar1->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 5);
      }
      auVar13 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x20,qVar10 + n + lVar11,Grow);
      this->d = (Data *)auVar13._0_8_;
      this->ptr = (pair<QModelIndex,_int> *)auVar13._8_8_;
      goto LAB_005b7f37;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (pair<QModelIndex,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar11 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    ppVar8 = this->ptr;
    ppVar9 = ppVar8 + lVar11;
    if ((old != (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0) || (bVar2)) {
      if ((lVar11 != 0) && (0 < lVar11)) {
        ppVar12 = local_38.ptr + local_38.size;
        do {
          iVar6 = (ppVar8->first).r;
          iVar7 = (ppVar8->first).c;
          qVar3 = (ppVar8->first).i;
          iVar4 = ppVar8->second;
          uVar5 = *(undefined4 *)&ppVar8->field_0x1c;
          (ppVar12->first).m.ptr = (ppVar8->first).m.ptr;
          ppVar12->second = iVar4;
          *(undefined4 *)&ppVar12->field_0x1c = uVar5;
          (ppVar12->first).r = iVar6;
          (ppVar12->first).c = iVar7;
          (ppVar12->first).i = qVar3;
          ppVar8 = ppVar8 + 1;
          local_38.size = local_38.size + 1;
          ppVar12 = ppVar12 + 1;
        } while (ppVar8 < ppVar9);
      }
    }
    else if ((lVar11 != 0) && (0 < lVar11)) {
      ppVar12 = local_38.ptr + local_38.size;
      do {
        iVar6 = (ppVar8->first).r;
        iVar7 = (ppVar8->first).c;
        qVar3 = (ppVar8->first).i;
        iVar4 = ppVar8->second;
        uVar5 = *(undefined4 *)&ppVar8->field_0x1c;
        (ppVar12->first).m.ptr = (ppVar8->first).m.ptr;
        ppVar12->second = iVar4;
        *(undefined4 *)&ppVar12->field_0x1c = uVar5;
        (ppVar12->first).r = iVar6;
        (ppVar12->first).c = iVar7;
        (ppVar12->first).i = qVar3;
        ppVar8 = ppVar8 + 1;
        local_38.size = local_38.size + 1;
        ppVar12 = ppVar12 + 1;
      } while (ppVar8 < ppVar9);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  ppVar8 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar10 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = ppVar8;
  local_38.size = qVar10;
  if (old != (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = ppVar8;
    local_38.size = old->size;
    old->size = qVar10;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x20,0x10);
    }
  }
LAB_005b7f37:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }